

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_SetXYZ(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  void *pvVar1;
  void *pvVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  char *pcVar5;
  undefined8 *puVar6;
  bool bVar7;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_004351e0;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar6 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar6 != (undefined8 *)0x0) {
        pPVar4 = (PClass *)puVar6[1];
        if (pPVar4 == (PClass *)0x0) {
          pPVar4 = (PClass *)(**(code **)*puVar6)(puVar6);
          puVar6[1] = pPVar4;
        }
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar3 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004351e0;
        }
        goto LAB_00435169;
      }
    }
    else if (puVar6 != (undefined8 *)0x0) goto LAB_004351d0;
    puVar6 = (undefined8 *)0x0;
LAB_00435169:
    if (numparam == 1) {
      pcVar5 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        if (numparam < 3) {
          pcVar5 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\x01') {
            if (numparam == 3) {
              pcVar5 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                pvVar1 = param[1].field_0.field_1.a;
                pvVar2 = param[2].field_0.field_1.a;
                puVar6[0xb] = param[3].field_0.field_1.a;
                puVar6[10] = pvVar2;
                puVar6[9] = pvVar1;
                return 0;
              }
              pcVar5 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar5,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x1e3e,
                          "int AF_AActor_SetXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar5 = "param[paramnum].Type == REGT_FLOAT";
        }
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x1e3d,
                      "int AF_AActor_SetXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pcVar5 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1e3c,"int AF_AActor_SetXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_004351d0:
  pcVar5 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004351e0:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1e3b,"int AF_AActor_SetXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SetXYZ)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	self->SetXYZ(x, y, z);
	return 0; 
}